

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O3

_Bool tbl_MoveDeskToDesk(int sourceIdx,int targetIdx)

{
  SolStack_t *stackPtr;
  undefined4 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uVar5;
  ECardFace_t *pEVar6;
  Card_t card;
  Card_t helpCard;
  SolStack_t helpStack;
  Card_t local_2b0;
  SolStack_t local_2a0;
  
  sVar4 = DeskStacks[sourceIdx].m_size;
  if (sVar4 == 0) {
    return false;
  }
  stackPtr = DeskStacks + sourceIdx;
  pEVar6 = &DeskStacks[sourceIdx].m_cards[0].m_face;
  uVar5 = 0;
  do {
    if (*pEVar6 == CF_UP) {
      uVar1 = ((Card_t *)(pEVar6 + -2))->m_type;
      uVar2 = ((Card_t *)(pEVar6 + -2))->m_color;
      card.m_color = uVar2;
      card.m_type = uVar1;
      card.m_face = CF_UP;
      _Var3 = IsCardMovableToDesk(card,DeskStacks + targetIdx);
      if (_Var3) {
        stk_InitEmpty(&local_2a0);
        if (uVar5 < stackPtr->m_size) {
          do {
            _Var3 = stk_Pop(stackPtr,&local_2b0);
            if (_Var3) {
              stk_PushCopy(&local_2a0,local_2b0);
            }
          } while (uVar5 < stackPtr->m_size);
        }
        _Var3 = stk_Pop(&local_2a0,&local_2b0);
        if (_Var3) {
          do {
            stk_PushCopy(DeskStacks + targetIdx,local_2b0);
            _Var3 = stk_Pop(&local_2a0,&local_2b0);
          } while (_Var3);
        }
        stk_TurnTopCardUp(stackPtr);
        return true;
      }
      sVar4 = stackPtr->m_size;
    }
    uVar5 = uVar5 + 1;
    pEVar6 = pEVar6 + 3;
  } while (uVar5 < sVar4);
  return false;
}

Assistant:

bool tbl_MoveDeskToDesk(int sourceIdx, int targetIdx)
{
  SolStack_t* srcStackPtr = &DeskStacks[sourceIdx];
  SolStack_t* targetPtr = &DeskStacks[targetIdx];
  SolStack_t helpStack;
  Card_t helpCard;
  Card_t* srcCardPtr = NULL;
  int srcCardIdx;

  // try to find card facing up in the source column that would fit on target
  // card or empty slot
  for (srcCardIdx = 0; srcCardIdx < srcStackPtr->m_size; srcCardIdx++) {
    srcCardPtr = &srcStackPtr->m_cards[srcCardIdx];
    if (srcCardPtr->m_face == CF_UP &&
        IsCardMovableToDesk(*srcCardPtr, targetPtr)) {
      break; // got it
    }
    srcCardPtr = NULL;
  }

  if (!srcCardPtr) {
    return false;
  }

  // move cards from one stack to the other
  stk_InitEmpty(&helpStack);

  while (srcCardIdx < srcStackPtr->m_size) {
    if (stk_Pop(srcStackPtr, &helpCard)) {
      stk_PushCopy(&helpStack, helpCard);
    }
  }

  while (stk_Pop(&helpStack, &helpCard)) {
    stk_PushCopy(targetPtr, helpCard);
  }

  stk_TurnTopCardUp(srcStackPtr);

  return true;
}